

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

sample_type __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::encoder_strategy>::do_regular
          (jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::encoder_strategy> *this,
          int32_t qs,int32_t x,int32_t predicted,encoder_strategy *param_4)

{
  int iVar1;
  int32_t k;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint error_value;
  int iVar5;
  context_regular_mode *this_00;
  
  uVar4 = qs >> 0x1f;
  iVar1 = -qs;
  if (0 < qs) {
    iVar1 = qs;
  }
  this_00 = (this->contexts_)._M_elems + iVar1;
  k = context_regular_mode::get_golomb_coding_parameter(this_00);
  iVar5 = (predicted - uVar4) + ((this->contexts_)._M_elems[iVar1].c_ ^ uVar4);
  uVar2 = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  if (0xffe < iVar5) {
    iVar5 = 0xfff;
  }
  uVar3 = (x - iVar5 ^ uVar4) - uVar4;
  error_value = (int)(uVar3 * 0x100000) >> 0x14;
  if (k == 0) {
    uVar2 = (this->contexts_)._M_elems[iVar1].n_ + (this->contexts_)._M_elems[iVar1].b_ * 2 + -1 >>
            0x1f;
  }
  uVar2 = uVar2 ^ error_value;
  if ((int)uVar2 < 0x40000000) {
    encode_mapped_value(this,k,uVar2 * 2 ^ (int)uVar2 >> 0x1e,0x30);
    context_regular_mode::update_variables_and_bias(this_00,error_value,0,0x40);
    uVar4 = ((uVar3 ^ uVar4) - uVar4) + iVar5 & 0xfff;
    if (uVar4 == x) {
      return (sample_type)uVar4;
    }
    __assert_fail("traits_.is_near(traits_.compute_reconstructed_sample(predicted_value, apply_sign(error_value, sign)), x)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                  ,0x15c,
                  "sample_type charls::jls_codec<charls::lossless_traits<unsigned short, 12>, charls::encoder_strategy>::do_regular(const int32_t, const int32_t, const int32_t, encoder_strategy *) [Traits = charls::lossless_traits<unsigned short, 12>, Strategy = charls::encoder_strategy]"
                 );
  }
  __assert_fail("error_value <= std::numeric_limits<int32_t>::max() / 2",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                ,0x51,"int32_t charls::map_error_value(const int32_t)");
}

Assistant:

do_regular(const int32_t qs, const int32_t x, const int32_t predicted,
                                        encoder_strategy* /*template_selector*/)
    {
        const int32_t sign{bit_wise_sign(qs)};
        context_regular_mode& context{contexts_[apply_sign(qs, sign)]};
        const int32_t k{context.get_golomb_coding_parameter()};
        const int32_t predicted_value{traits_.correct_prediction(predicted + apply_sign(context.c(), sign))};
        const int32_t error_value{traits_.compute_error_value(apply_sign(x - predicted_value, sign))};

        encode_mapped_value(k, map_error_value(context.get_error_correction(k | traits_.near_lossless) ^ error_value),
                            traits_.limit);
        context.update_variables_and_bias(error_value, traits_.near_lossless, traits_.reset_threshold);
        ASSERT(traits_.is_near(traits_.compute_reconstructed_sample(predicted_value, apply_sign(error_value, sign)), x));
        return static_cast<sample_type>(
            traits_.compute_reconstructed_sample(predicted_value, apply_sign(error_value, sign)));
    }